

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  gost_subst_block *pgVar3;
  int iVar4;
  FILE *f;
  char *__s;
  uint uVar5;
  long lVar6;
  gost_subst_block *subst_block;
  uint local_1160;
  uint local_115c;
  gost_hash_ctx ctx;
  char calcsum [65];
  char inhash [65];
  char filename [4096];
  
  bVar2 = true;
  bVar1 = 0;
  f = (FILE *)0x0;
  pgVar3 = &GostR3411_94_CryptoProParamSet;
  do {
    while( true ) {
      do {
        subst_block = pgVar3;
        iVar4 = getopt(argc,argv,"bc::tv");
        pgVar3 = subst_block;
      } while (iVar4 == 0x62);
      if (iVar4 == 99) break;
      pgVar3 = &GostR3411_94_TestParamSet;
      if (iVar4 != 0x74) {
        if (iVar4 != 0x76) {
          if (iVar4 == -1) {
            init_gost_hash_ctx(&ctx,subst_block);
            if (f == (FILE *)0x0) {
              lVar6 = (long)_optind;
              if (_optind != argc) {
                local_1160 = 0;
                for (; lVar6 < argc; lVar6 = lVar6 + 1) {
                  iVar4 = hash_file(&ctx,argv[lVar6],filename,0);
                  if (iVar4 == 0) {
                    local_1160 = local_1160 + 1;
                  }
                  else {
                    printf("%s %s\n",filename,argv[lVar6]);
                  }
                }
                goto LAB_001015cb;
              }
              iVar4 = fileno(_stdin);
              iVar4 = hash_stream(&ctx,iVar4,filename);
              if (iVar4 != 0) {
                printf("%s -\n",filename);
                exit(0);
              }
              perror("stdin");
              iVar4 = 1;
              goto LAB_00101602;
            }
          }
          else {
            fprintf(_stderr,"invalid option %c",(ulong)_optopt);
            help();
          }
          if (((f != _stdin) || (argc <= _optind)) ||
             (f = fopen(argv[_optind],"r"), f != (FILE *)0x0)) {
            local_115c = 0;
            local_1160 = 0;
            uVar5 = 0;
            goto LAB_00101462;
          }
          __s = argv[_optind];
          goto LAB_001015fb;
        }
        bVar1 = 1;
        bVar2 = false;
        pgVar3 = subst_block;
      }
    }
    f = _stdin;
  } while ((_optarg == (char *)0x0) || (f = fopen(_optarg,"r"), __s = _optarg, f != (FILE *)0x0));
LAB_001015fb:
  perror(__s);
  iVar4 = 2;
LAB_00101602:
  exit(iVar4);
LAB_00101462:
  iVar4 = get_line((FILE *)f,inhash,filename);
  if (iVar4 == 0) {
    if (local_115c != 0) {
      fprintf(_stderr,"%s: WARNING %d of %d file(s) cannot be processed\n",*argv,(ulong)local_115c,
              (ulong)uVar5);
    }
    if ((bool)(bVar1 & local_1160 != 0)) {
      fprintf(_stderr,"%s: %d of %d file(f) failed GOST hash sum check\n",*argv,(ulong)local_1160,
              (ulong)uVar5);
    }
    local_1160 = local_1160 | local_115c;
LAB_001015cb:
    exit((uint)(local_1160 != 0));
  }
  iVar4 = hash_file(&ctx,filename,calcsum,0);
  if (iVar4 == 0) {
    local_115c = local_115c + 1;
  }
  else {
    iVar4 = strncmp(calcsum,inhash,0x41);
    if (iVar4 != 0) {
      if (bVar2) {
        fprintf(_stderr,"%s: GOST hash sum check failed for \'%s\'\n",*argv);
      }
      else {
        fprintf(_stderr,"%s\tFAILED\n",filename);
      }
      uVar5 = uVar5 + 1;
      local_1160 = local_1160 + 1;
      goto LAB_00101462;
    }
    if (!bVar2) {
      fprintf(_stderr,"%s\tOK\n",filename);
    }
  }
  uVar5 = uVar5 + 1;
  goto LAB_00101462;
}

Assistant:

int main(int argc, char **argv)
{
    int c, i;
    int verbose = 0;
    int errors = 0;
    int open_mode = O_RDONLY;
    gost_subst_block *b = &GostR3411_94_CryptoProParamSet;
    FILE *check_file = NULL;
    gost_hash_ctx ctx;

    while ((c = getopt(argc, argv, "bc::tv")) != -1) {
        switch (c) {
        case 'v':
            verbose = 1;
            break;
        case 't':
            b = &GostR3411_94_TestParamSet;
            break;
        case 'b':
            open_mode |= O_BINARY;
            break;
        case 'c':
            if (optarg) {
                check_file = fopen(optarg, "r");
                if (!check_file) {
                    perror(optarg);
                    exit(2);
                }
            } else {
                check_file = stdin;
            }
            break;
        default:
            fprintf(stderr, "invalid option %c", optopt);
            help();
        }
    }
    init_gost_hash_ctx(&ctx, b);
    if (check_file) {
        char inhash[65], calcsum[65], filename[PATH_MAX];
        int failcount = 0, count = 0;
        errors = 0;
        if (check_file == stdin && optind < argc) {
            check_file = fopen(argv[optind], "r");
            if (!check_file) {
                perror(argv[optind]);
                exit(2);
            }
        }
        while (get_line(check_file, inhash, filename)) {
            count++;
            if (!hash_file(&ctx, filename, calcsum, open_mode)) {
                errors++;
                continue;
            }
            if (strncmp(calcsum, inhash, 65) == 0) {
                if (verbose) {
                    fprintf(stderr, "%s\tOK\n", filename);
                }
            } else {
                if (verbose) {
                    fprintf(stderr, "%s\tFAILED\n", filename);
                } else {
                    fprintf(stderr,
                            "%s: GOST hash sum check failed for '%s'\n",
                            argv[0], filename);
                }
                failcount++;
            }
        }
        if (errors) {
            fprintf(stderr,
                    "%s: WARNING %d of %d file(s) cannot be processed\n",
                    argv[0], errors, count);

        }
        if (verbose && failcount) {
            fprintf(stderr,
                    "%s: %d of %d file(f) failed GOST hash sum check\n",
                    argv[0], failcount, count);
        }
        exit((failcount || errors) ? 1 : 0);
    }
    if (optind == argc) {
        char sum[65];
#ifdef _WIN32
        if (open_mode & O_BINARY) {
            _setmode(fileno(stdin), O_BINARY);
        }
#endif
        if (!hash_stream(&ctx, fileno(stdin), sum)) {
            perror("stdin");
            exit(1);
        }
        printf("%s -\n", sum);
        exit(0);
    }
    for (i = optind; i < argc; i++) {
        char sum[65];
        if (!hash_file(&ctx, argv[i], sum, open_mode)) {
            errors++;
        } else {
            printf("%s %s\n", sum, argv[i]);
        }
    }
    exit(errors ? 1 : 0);
}